

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<const_ON_SubDEdge_*> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges,bool bIgnoreCorners)

{
  ON_SubDEdge *edge;
  uint uVar1;
  ON_SubDEdge **ppOVar2;
  ON_SubDEdgePtr local_68;
  ON_SubDEdgePtr eptr;
  ON_SubDEdge *e;
  undefined1 local_40 [4];
  uint i;
  ON_SimpleArray<ON_SubDEdgePtr> unsorted_eptrs;
  uint unsorted_edge_count;
  bool bIgnoreCorners_local;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  uint minimum_chain_length_local;
  ON_SimpleArray<const_ON_SubDEdge_*> *unsorted_edges_local;
  
  unsorted_eptrs.m_capacity._3_1_ = bIgnoreCorners;
  unsorted_eptrs.m_count = ON_SimpleArray<const_ON_SubDEdge_*>::Count(unsorted_edges);
  ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray
            ((ON_SimpleArray<ON_SubDEdgePtr> *)local_40,(ulong)(uint)unsorted_eptrs.m_count);
  for (e._4_4_ = 0; e._4_4_ < (uint)unsorted_eptrs.m_count; e._4_4_ = e._4_4_ + 1) {
    ppOVar2 = ON_SimpleArray<const_ON_SubDEdge_*>::operator[](unsorted_edges,e._4_4_);
    edge = *ppOVar2;
    if ((((edge != (ON_SubDEdge *)0x0) && (edge->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
        (edge->m_vertex[1] != (ON_SubDVertex *)0x0)) && (edge->m_vertex[0] != edge->m_vertex[1])) {
      local_68 = ON_SubDEdgePtr::Create(edge,0);
      if ((edge->m_face_count == 1) && ((edge->m_face2[0].m_ptr & 1) == 0)) {
        local_68 = ON_SubDEdgePtr::Reversed(&local_68);
      }
      ON_SimpleArray<ON_SubDEdgePtr>::Append((ON_SimpleArray<ON_SubDEdgePtr> *)local_40,&local_68);
    }
  }
  uVar1 = SortEdgesIntoEdgeChains
                    ((ON_SimpleArray<ON_SubDEdgePtr> *)local_40,minimum_chain_length,sorted_edges,
                     (bool)(unsorted_eptrs.m_capacity._3_1_ & 1));
  ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray((ON_SimpleArray<ON_SubDEdgePtr> *)local_40);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< const ON_SubDEdge* >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges,
  const bool bIgnoreCorners
)
{
  const unsigned int unsorted_edge_count = unsorted_edges.Count();
  ON_SimpleArray< ON_SubDEdgePtr > unsorted_eptrs(unsorted_edge_count);
  for (unsigned i = 0; i < unsorted_edge_count; ++i)
  {
    const ON_SubDEdge* e = unsorted_edges[i];
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;
    ON_SubDEdgePtr eptr = ON_SubDEdgePtr::Create(e, 0);
    if (1 == e->m_face_count && 0 == ON_SUBD_FACE_DIRECTION(e->m_face2[0].m_ptr))
      eptr = eptr.Reversed();
    unsorted_eptrs.Append(eptr);
  }
  return ON_SubDEdgeChain::SortEdgesIntoEdgeChains(unsorted_eptrs, minimum_chain_length, sorted_edges, bIgnoreCorners);
}